

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O0

void Fl_Scroll::draw_clip(void *v,int X,int Y,int W,int H)

{
  Fl_Widget *widget;
  Fl_Image *pFVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Color c;
  Fl_Window *pFVar7;
  Fl_Window *pFVar8;
  Fl_Image *pFVar9;
  Fl_Widget *o;
  Fl_Widget **ppFStack_30;
  int i;
  Fl_Widget **a;
  Fl_Scroll *s;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  void *v_local;
  
  fl_push_clip(X,Y,W,H);
  FVar2 = Fl_Widget::box((Fl_Widget *)v);
  if (((((FVar2 == FL_NO_BOX) || (FVar2 - FL_UP_FRAME < 2)) || (FVar2 - FL_THIN_UP_FRAME < 2)) ||
      ((FVar2 - FL_ENGRAVED_FRAME < 2 || (FVar2 - FL_BORDER_FRAME < 2)))) ||
     ((FVar2 == _FL_ROUNDED_FRAME ||
      ((FVar2 == _FL_OVAL_FRAME ||
       (FVar2 == _FL_PLASTIC_UP_FRAME || FVar2 == _FL_PLASTIC_DOWN_FRAME)))))) {
    pFVar7 = (Fl_Window *)Fl_Widget::parent((Fl_Widget *)v);
    pFVar8 = Fl_Widget::window((Fl_Widget *)v);
    pFVar1 = Fl::scheme_bg_;
    if ((pFVar7 == pFVar8) && (Fl::scheme_bg_ != (Fl_Image *)0x0)) {
      pFVar9 = Fl_Tiled_Image::image((Fl_Tiled_Image *)Fl::scheme_bg_);
      iVar3 = Fl_Image::w(pFVar9);
      pFVar9 = Fl_Tiled_Image::image((Fl_Tiled_Image *)Fl::scheme_bg_);
      iVar4 = Fl_Image::h(pFVar9);
      pFVar9 = Fl_Tiled_Image::image((Fl_Tiled_Image *)Fl::scheme_bg_);
      iVar5 = Fl_Image::w(pFVar9);
      pFVar9 = Fl_Tiled_Image::image((Fl_Tiled_Image *)Fl::scheme_bg_);
      iVar6 = Fl_Image::h(pFVar9);
      (*pFVar1->_vptr_Fl_Image[7])
                (pFVar1,(ulong)(uint)(X - X % iVar3),(ulong)(uint)(Y - Y % iVar4),
                 (ulong)(uint)(W + iVar5),(ulong)(uint)(H + iVar6),0,0);
      goto LAB_0020ec2a;
    }
  }
  c = Fl_Widget::color((Fl_Widget *)v);
  fl_color(c);
  fl_rectf(X,Y,W,H);
LAB_0020ec2a:
  ppFStack_30 = Fl_Group::array((Fl_Group *)v);
  iVar3 = Fl_Group::children((Fl_Group *)v);
  o._4_4_ = iVar3 + -2;
  while (o._4_4_ != 0) {
    widget = *ppFStack_30;
    Fl_Group::draw_child((Fl_Group *)v,widget);
    Fl_Group::draw_outside_label((Fl_Group *)v,widget);
    o._4_4_ = o._4_4_ + -1;
    ppFStack_30 = ppFStack_30 + 1;
  }
  fl_pop_clip();
  return;
}

Assistant:

void Fl_Scroll::draw_clip(void* v,int X, int Y, int W, int H) {
  fl_push_clip(X,Y,W,H);
  Fl_Scroll* s = (Fl_Scroll*)v;
  // erase background as needed...
  switch (s->box()) {
    case FL_NO_BOX :
    case FL_UP_FRAME :
    case FL_DOWN_FRAME :
    case FL_THIN_UP_FRAME :
    case FL_THIN_DOWN_FRAME :
    case FL_ENGRAVED_FRAME :
    case FL_EMBOSSED_FRAME :
    case FL_BORDER_FRAME :
    case _FL_SHADOW_FRAME :
    case _FL_ROUNDED_FRAME :
    case _FL_OVAL_FRAME :
    case _FL_PLASTIC_UP_FRAME :
    case _FL_PLASTIC_DOWN_FRAME :
        if (s->parent() == (Fl_Group *)s->window() && Fl::scheme_bg_) {
	  Fl::scheme_bg_->draw(X-(X%((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->w()),
	                       Y-(Y%((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->h()),
	                       W+((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->w(),
			       H+((Fl_Tiled_Image *)Fl::scheme_bg_)->image()->h());
	  break;
        }

    default :
	fl_color(s->color());
	fl_rectf(X,Y,W,H);
	break;
  }
  Fl_Widget*const* a = s->array();
  for (int i=s->children()-2; i--;) {
    Fl_Widget& o = **a++;
    s->draw_child(o);
    s->draw_outside_label(o);
  }
  fl_pop_clip();
}